

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelController.cpp
# Opt level: O2

string * __thiscall
cali::ChannelController::name_abi_cxx11_(string *__return_storage_ptr__,ChannelController *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (this->mP).
             super___shared_ptr<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelController::name() const
{
    return mP->name;
}